

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu.cpp
# Opt level: O0

int __thiscall ncnn::GELU::forward_inplace(GELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  float fVar3;
  int i_1;
  float *ptr_1;
  int q_1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_ffffffffffffff00;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff08;
  int local_ec;
  Mat local_e8;
  float *local_a0;
  int local_94;
  int local_90;
  Mat local_80;
  Mat *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x38);
  local_28 = local_1c * local_20;
  if ((*(byte *)(in_RDI + 0xd0) & 1) == 0) {
    for (local_94 = 0; local_94 < local_24; local_94 = local_94 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_e8);
      ncnn::Mat::~Mat((Mat *)0x91020d);
      local_a0 = pfVar2;
      for (local_ec = 0; local_ec < local_28; local_ec = local_ec + 1) {
        fVar1 = local_a0[local_ec];
        fVar3 = erfcf(local_a0[local_ec] * -0.70710677);
        local_a0[local_ec] = fVar1 * 0.5 * fVar3;
      }
    }
  }
  else {
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      this_00 = &local_80;
      ncnn::Mat::channel(in_stack_ffffffffffffff08,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff08 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x91006e);
      local_38 = in_stack_ffffffffffffff08;
      for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
        fVar1 = *(float *)((long)&local_38->data + (long)local_90 * 4);
        fVar3 = tanhf((*(float *)((long)&local_38->data + (long)local_90 * 4) +
                      *(float *)((long)&local_38->data + (long)local_90 * 4) * 0.044715 *
                      *(float *)((long)&local_38->data + (long)local_90 * 4) *
                      *(float *)((long)&local_38->data + (long)local_90 * 4)) * 0.7978845);
        *(float *)((long)&local_38->data + (long)local_90 * 4) = fVar1 * 0.5 * (fVar3 + 1.0);
      }
    }
  }
  return 0;
}

Assistant:

int GELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (fast_gelu)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
                ptr[i] = 0.5f * ptr[i] * (1.0f + tanhf(0.79788452f * (ptr[i] + 0.044715f * ptr[i] * ptr[i] * ptr[i])));
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                // y = x * P(X <= x) where X ~ N(0, 1)
                ptr[i] = 0.5f * ptr[i] * erfcf(-0.70710678f * ptr[i]);
            }
        }
    }

    return 0;
}